

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O2

void __thiscall
TPZDohrAssembly<long_double>::Assemble
          (TPZDohrAssembly<long_double> *this,int isub,TPZFMatrix<long_double> *local,
          TPZFMatrix<long_double> *global)

{
  uint uVar1;
  TPZVec<int> *pTVar2;
  ulong uVar3;
  longdouble *plVar4;
  ulong uVar5;
  ulong uVar6;
  ulong col;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  
  pTVar2 = (this->fFineEqs).fStore;
  uVar1 = (uint)pTVar2[isub].fNElements;
  col = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = col;
  }
  uVar1 = (uint)(local->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = col;
  }
  for (; col != uVar3; col = col + 1) {
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      (*(local->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(local,uVar6,col);
      plVar4 = TPZFMatrix<long_double>::operator()(global,(long)pTVar2[isub].fStore[uVar6],col);
      *plVar4 = in_ST0 + *plVar4;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
    }
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::Assemble(int isub, const TPZFMatrix<TVar> &local, TPZFMatrix<TVar> &global) const
{
	TPZVec<int> &avec = fFineEqs[isub];
	int neq = avec.NElements();
    int ncols = local.Cols();
	int ieq;
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            global(avec[ieq],ic) += local.GetVal(ieq,ic);
        }
    }
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Assembling destination indices " << avec << std::endl;
		local.Print("Input vector",sout);
		global.Print("Resulting vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
}